

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# darLib.c
# Opt level: O0

int Dar2_LibEval(Gia_Man_t *p,Vec_Int_t *vCutLits,uint uTruth,int fKeepLevel,Vec_Int_t *vLeavesBest2
                )

{
  int iVar1;
  uint Class_00;
  int iVar2;
  Dar_LibObj_t *pObj_00;
  int nNodesGained;
  int nNodesAdded;
  int nNodesSaved;
  int Class;
  int k;
  int Out;
  Dar_LibObj_t *pObj;
  int local_40;
  int p_ClassBest;
  int p_GainBest;
  int p_LevelBest;
  int p_OutNumBest;
  int p_OutBest;
  Vec_Int_t *vLeavesBest2_local;
  int fKeepLevel_local;
  uint uTruth_local;
  Vec_Int_t *vCutLits_local;
  Gia_Man_t *p_local;
  
  p_LevelBest = -1;
  p_ClassBest = 1000000;
  local_40 = -1000000;
  iVar1 = Vec_IntSize(vCutLits);
  if (iVar1 != 4) {
    __assert_fail("Vec_IntSize(vCutLits) == 4",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/opt/dar/darLib.c"
                  ,0x4ab,
                  "int Dar2_LibEval(Gia_Man_t *, Vec_Int_t *, unsigned int, int, Vec_Int_t *)");
  }
  if (uTruth >> 0x10 != 0) {
    __assert_fail("(uTruth >> 16) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/opt/dar/darLib.c"
                  ,0x4ac,
                  "int Dar2_LibEval(Gia_Man_t *, Vec_Int_t *, unsigned int, int, Vec_Int_t *)");
  }
  iVar1 = Dar2_LibCutMatch(p,vCutLits,uTruth);
  if (iVar1 == 0) {
    p_local._4_4_ = -1;
  }
  else {
    Class_00 = (uint)s_DarLib->pMap[uTruth];
    Dar2_LibEvalAssignNums(p,Class_00);
    for (Class = 0; Class < s_DarLib->nSubgr0[(int)Class_00]; Class = Class + 1) {
      pObj_00 = Dar_LibObj(s_DarLib,s_DarLib->pSubgr0[(int)Class_00][Class]);
      iVar1 = Dar2_LibEval_rec(pObj_00,Class);
      iVar1 = -iVar1;
      if (fKeepLevel == 0) {
        if ((local_40 <= iVar1) &&
           ((iVar1 != local_40 || (s_DarLib->pDatas[(ulong)*pObj_00 >> 0x24].Level < p_ClassBest))))
        goto LAB_005e2262;
      }
      else if ((s_DarLib->pDatas[(ulong)*pObj_00 >> 0x24].Level <= p_ClassBest) &&
              ((s_DarLib->pDatas[(ulong)*pObj_00 >> 0x24].Level != p_ClassBest || (local_40 < iVar1)
               ))) {
LAB_005e2262:
        Vec_IntClear(vLeavesBest2);
        for (nNodesSaved = 0; iVar2 = Vec_IntSize(vCutLits), nNodesSaved < iVar2;
            nNodesSaved = nNodesSaved + 1) {
          Vec_IntPush(vLeavesBest2,s_DarLib->pDatas[nNodesSaved].field_0.iGunc);
        }
        p_LevelBest = s_DarLib->pSubgr0[(int)Class_00][Class];
        p_ClassBest = s_DarLib->pDatas[(ulong)*pObj_00 >> 0x24].Level;
        local_40 = iVar1;
      }
    }
    if (p_LevelBest == -1) {
      __assert_fail("p_OutBest != -1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/opt/dar/darLib.c"
                    ,0x4d9,
                    "int Dar2_LibEval(Gia_Man_t *, Vec_Int_t *, unsigned int, int, Vec_Int_t *)");
    }
    p_local._4_4_ = p_LevelBest;
  }
  return p_local._4_4_;
}

Assistant:

int Dar2_LibEval( Gia_Man_t * p, Vec_Int_t * vCutLits, unsigned uTruth, int fKeepLevel, Vec_Int_t * vLeavesBest2 )
{
    int p_OutBest    = -1;
    int p_OutNumBest = -1;
    int p_LevelBest  =  1000000;
    int p_GainBest   = -1000000;
    int p_ClassBest  = -1;
//    int fTraining    =  0;
    Dar_LibObj_t * pObj;
    int Out, k, Class, nNodesSaved, nNodesAdded, nNodesGained;
//    abctime clk = Abc_Clock();
    assert( Vec_IntSize(vCutLits) == 4 );
    assert( (uTruth >> 16) == 0 );
    // check if the cut exits and assigns leaves and their levels
    if ( !Dar2_LibCutMatch(p, vCutLits, uTruth) )
        return -1;
    // mark MFFC of the node
//    nNodesSaved = Dar2_LibCutMarkMffc( p->pAig, pRoot, pCut->nLeaves, p->pPars->fPower? &PowerSaved : NULL );
    nNodesSaved = 0;
    // evaluate the cut
    Class = s_DarLib->pMap[uTruth];
    Dar2_LibEvalAssignNums( p, Class );
    // profile outputs by their savings
//    p->nTotalSubgs += s_DarLib->nSubgr0[Class];
//    p->ClassSubgs[Class] += s_DarLib->nSubgr0[Class];
    for ( Out = 0; Out < s_DarLib->nSubgr0[Class]; Out++ )
    {
        pObj = Dar_LibObj(s_DarLib, s_DarLib->pSubgr0[Class][Out]);
//        nNodesAdded = Dar2_LibEval_rec( pObj, Out, nNodesSaved - !p->pPars->fUseZeros, Required, p->pPars->fPower? &PowerAdded : NULL );
        nNodesAdded = Dar2_LibEval_rec( pObj, Out );
        nNodesGained = nNodesSaved - nNodesAdded;
        if ( fKeepLevel )
        {
            if ( s_DarLib->pDatas[pObj->Num].Level >  p_LevelBest || 
                (s_DarLib->pDatas[pObj->Num].Level == p_LevelBest && nNodesGained <= p_GainBest) )
                continue;
        }
        else
        {
            if ( nNodesGained <  p_GainBest || 
                (nNodesGained == p_GainBest && s_DarLib->pDatas[pObj->Num].Level >= p_LevelBest) )
                continue;
        }
        // remember this possibility
        Vec_IntClear( vLeavesBest2 );
        for ( k = 0; k < Vec_IntSize(vCutLits); k++ )
            Vec_IntPush( vLeavesBest2, s_DarLib->pDatas[k].iGunc );
        p_OutBest    = s_DarLib->pSubgr0[Class][Out];
        p_OutNumBest = Out;
        p_LevelBest  = s_DarLib->pDatas[pObj->Num].Level;
        p_GainBest   = nNodesGained;
        p_ClassBest  = Class;
//        assert( p_LevelBest <= Required );
    }
//clk = Abc_Clock() - clk;
//p->ClassTimes[Class] += clk;
//p->timeEval += clk;
    assert( p_OutBest != -1 );
    return p_OutBest;
}